

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O0

RPCHelpMan * submitpackage(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffe238;
  allocator<RPCArg> *this;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar2;
  allocator<RPCResult> *paVar3;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffe240;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffe248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe270;
  UniValue *in_stack_ffffffffffffe278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe280;
  undefined7 in_stack_ffffffffffffe288;
  undefined1 in_stack_ffffffffffffe28f;
  string *in_stack_ffffffffffffe290;
  undefined7 in_stack_ffffffffffffe298;
  undefined1 in_stack_ffffffffffffe29f;
  undefined4 in_stack_ffffffffffffe2a0;
  Type in_stack_ffffffffffffe2a4;
  string *in_stack_ffffffffffffe2a8;
  undefined4 in_stack_ffffffffffffe2b0;
  Type in_stack_ffffffffffffe2b4;
  undefined4 in_stack_ffffffffffffe2b8;
  Type in_stack_ffffffffffffe2bc;
  RPCArg *in_stack_ffffffffffffe2c0;
  RPCArgOptions *in_stack_ffffffffffffe2e0;
  RPCExamples *in_stack_ffffffffffffe380;
  RPCResults *in_stack_ffffffffffffe388;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffe390;
  undefined1 *puVar4;
  string *in_stack_ffffffffffffe398;
  string *in_stack_ffffffffffffe3a0;
  RPCHelpMan *in_stack_ffffffffffffe3a8;
  undefined1 *local_1c50;
  undefined1 *local_1c38;
  undefined1 *local_1c20;
  undefined1 *local_1c08;
  undefined1 *local_1bf0;
  undefined1 *local_1bd8;
  undefined1 *local_1bc0;
  RPCMethodImpl *fun;
  undefined1 local_1890 [35];
  allocator<char> local_186d;
  allocator<char> local_186c;
  allocator<char> local_186b [3];
  pointer local_1868;
  pointer pRStack_1860;
  pointer local_1858;
  allocator<char> local_184a;
  allocator<char> local_1849 [29];
  allocator<char> local_182c;
  allocator<char> local_182b [31];
  allocator<char> local_180c;
  allocator<char> local_180b [19];
  undefined8 local_17f8;
  allocator<char> local_17ea;
  allocator<char> local_17e9 [31];
  allocator<char> local_17ca;
  allocator<char> local_17c9;
  _Alloc_hider local_17c8;
  size_type sStack_17c0;
  undefined1 local_17b8 [16];
  pointer local_17a8;
  pointer pbStack_17a0;
  pointer local_1798;
  allocator<char> local_1789 [31];
  allocator<char> local_176a;
  allocator<char> local_1769;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  allocator<char> local_174a;
  allocator<char> local_1749;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  allocator<char> local_172a;
  allocator<char> local_1729;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  allocator<char> local_170a;
  allocator<char> local_1709 [31];
  allocator<char> local_16ea;
  allocator<char> local_16e9 [31];
  allocator<char> local_16ca;
  allocator<char> local_16c9;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  allocator<char> local_16a2;
  allocator<char> local_16a1 [31];
  allocator<char> local_1682;
  allocator<char> local_1681 [29];
  allocator<char> local_1664;
  allocator<char> local_1663 [2];
  allocator<char> local_1661;
  undefined4 local_1660;
  allocator<char> local_1659 [32];
  allocator<char> local_1639;
  undefined4 local_1638;
  allocator<char> local_1631 [31];
  allocator<char> local_1612;
  allocator<char> local_1611 [321];
  undefined1 local_14d0 [136];
  undefined1 local_1448 [192];
  undefined1 local_1388 [136];
  undefined1 local_1300 [224];
  undefined1 local_1220 [408];
  undefined1 local_1088 [136];
  undefined8 local_1000;
  undefined1 local_f88 [680];
  undefined1 local_ce0 [64];
  undefined1 local_ca0 [136];
  undefined1 local_c18 [128];
  undefined1 local_b98 [272];
  RPCMethodImpl local_a88 [4];
  undefined1 local_a00 [200];
  undefined1 local_938;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined1 local_8f8;
  undefined1 local_8f7;
  undefined1 local_7b8;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined1 local_778;
  undefined1 local_777;
  allocator<RPCArg> local_638 [40];
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined1 local_5f8;
  undefined1 local_5f7;
  undefined1 local_5f0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined1 local_5b0;
  undefined1 local_5af;
  undefined1 local_508 [264];
  undefined1 local_400 [160];
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  local_1638 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe248,&in_stack_ffffffffffffe240->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  local_1660 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe248,&in_stack_ffffffffffffe240->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  local_5f0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe250);
  local_5c8 = 0;
  uStack_5c0 = 0;
  local_5b8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe238);
  local_5b0 = 0;
  local_5af = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
                 in_stack_ffffffffffffe2a8,in_stack_ffffffffffffe2a4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe29f,in_stack_ffffffffffffe298),
                 in_stack_ffffffffffffe290,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffe238);
  __l._M_len._0_7_ = in_stack_ffffffffffffe288;
  __l._M_array = (iterator)in_stack_ffffffffffffe280;
  __l._M_len._7_1_ = in_stack_ffffffffffffe28f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe278,__l,
             (allocator_type *)in_stack_ffffffffffffe270);
  local_638[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffe250);
  local_610 = 0;
  uStack_608 = 0;
  local_600 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe238);
  local_5f8 = 0;
  local_5f7 = 0;
  this = local_638;
  RPCArg::RPCArg(in_stack_ffffffffffffe2c0,
                 (string *)CONCAT44(in_stack_ffffffffffffe2bc,in_stack_ffffffffffffe2b8),
                 in_stack_ffffffffffffe2b4,(Fallback *)in_stack_ffffffffffffe2a8,
                 (string *)CONCAT44(in_stack_ffffffffffffe2a4,in_stack_ffffffffffffe2a0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffe29f,in_stack_ffffffffffffe298),
                 in_stack_ffffffffffffe2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  CFeeRate::GetFeePerK((CFeeRate *)this);
  FormatMoney_abi_cxx11_((CAmount)in_stack_ffffffffffffe290);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_ffffffffffffe278,in_stack_ffffffffffffe270);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
                 in_stack_ffffffffffffe280);
  std::operator+(in_stack_ffffffffffffe250,(char *)in_stack_ffffffffffffe248);
  local_7b8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe250);
  local_790 = 0;
  uStack_788 = 0;
  local_780 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  local_778 = 0;
  local_777 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
                 in_stack_ffffffffffffe2a8,in_stack_ffffffffffffe2a4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe29f,in_stack_ffffffffffffe298),
                 in_stack_ffffffffffffe290,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  FormatMoney_abi_cxx11_((CAmount)in_stack_ffffffffffffe290);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_ffffffffffffe278,in_stack_ffffffffffffe270);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
                 in_stack_ffffffffffffe280);
  std::operator+(in_stack_ffffffffffffe250,(char *)in_stack_ffffffffffffe248);
  local_938 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe250);
  local_910 = 0;
  uStack_908 = 0;
  local_900 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  local_8f8 = 0;
  local_8f7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
                 in_stack_ffffffffffffe2a8,in_stack_ffffffffffffe2a4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe29f,in_stack_ffffffffffffe298),
                 in_stack_ffffffffffffe290,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288));
  std::allocator<RPCArg>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe288;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe280;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe28f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe278,__l_00,
             (allocator_type *)in_stack_ffffffffffffe270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  local_16c8 = 0;
  uStack_16c0 = 0;
  local_16b8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2bc,
             (string *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
             in_stack_ffffffffffffe2a8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2a4,in_stack_ffffffffffffe2a0),
             (bool)in_stack_ffffffffffffe29f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  local_1728 = 0;
  uStack_1720 = 0;
  local_1718 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2bc,
             (string *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
             in_stack_ffffffffffffe2a8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2a4,in_stack_ffffffffffffe2a0),
             (bool)in_stack_ffffffffffffe29f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  local_1748 = 0;
  uStack_1740 = 0;
  local_1738 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)this & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe2bc,in_stack_ffffffffffffe2b8),
             in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2a8,
             SUB41(in_stack_ffffffffffffe2a4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe29f,in_stack_ffffffffffffe298),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe290,
             (bool)in_stack_ffffffffffffe28f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  local_1768 = 0;
  uStack_1760 = 0;
  local_1758 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe2bc,in_stack_ffffffffffffe2b8),
             in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2a8,
             SUB41(in_stack_ffffffffffffe2a4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe29f,in_stack_ffffffffffffe298),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe290,
             (bool)in_stack_ffffffffffffe28f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
                 in_stack_ffffffffffffe280);
  local_17a8 = (pointer)0x0;
  pbStack_17a0 = (pointer)0x0;
  local_1798 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2bc,
             (string *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
             in_stack_ffffffffffffe2a8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2a4,in_stack_ffffffffffffe2a0),
             (bool)in_stack_ffffffffffffe29f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
                 in_stack_ffffffffffffe280);
  std::operator+(in_stack_ffffffffffffe250,(char *)in_stack_ffffffffffffe248);
  local_17c8._M_p = (pointer)0x0;
  sStack_17c0 = 0;
  local_17b8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  paVar3 = (allocator<RPCResult> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe2bc,in_stack_ffffffffffffe2b8),
             in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2a8,
             SUB41(in_stack_ffffffffffffe2a4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe29f,in_stack_ffffffffffffe298),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe290,
             (bool)in_stack_ffffffffffffe28f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  local_180b[3] = (allocator<char>)0x0;
  local_180b[4] = (allocator<char>)0x0;
  local_180b[5] = (allocator<char>)0x0;
  local_180b[6] = (allocator<char>)0x0;
  local_180b[7] = (allocator<char>)0x0;
  local_180b[8] = (allocator<char>)0x0;
  local_180b[9] = (allocator<char>)0x0;
  local_180b[10] = (allocator<char>)0x0;
  local_180b[0xb] = (allocator<char>)0x0;
  local_180b[0xc] = (allocator<char>)0x0;
  local_180b[0xd] = (allocator<char>)0x0;
  local_180b[0xe] = (allocator<char>)0x0;
  local_180b[0xf] = (allocator<char>)0x0;
  local_180b[0x10] = (allocator<char>)0x0;
  local_180b[0x11] = (allocator<char>)0x0;
  local_180b[0x12] = (allocator<char>)0x0;
  local_17f8._0_1_ = '\0';
  local_17f8._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2bc,
             (string *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
             in_stack_ffffffffffffe2a8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2a4,in_stack_ffffffffffffe2a0),
             (bool)in_stack_ffffffffffffe29f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffe288;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe280;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffe28f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe278,__l_01,
             (allocator_type *)in_stack_ffffffffffffe270);
  paVar3 = (allocator<RPCResult> *)((ulong)paVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe2bc,in_stack_ffffffffffffe2b8),
             in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2a8,
             SUB41(in_stack_ffffffffffffe2a4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe29f,in_stack_ffffffffffffe298),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe290,
             (bool)in_stack_ffffffffffffe28f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffe288;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe280;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffe28f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe278,__l_02,
             (allocator_type *)in_stack_ffffffffffffe270);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)paVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe2bc,in_stack_ffffffffffffe2b8),
             in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2a8,
             SUB41(in_stack_ffffffffffffe2a4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe29f,in_stack_ffffffffffffe298),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe290,
             (bool)in_stack_ffffffffffffe28f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  local_182b[3] = (allocator<char>)0x0;
  local_182b[4] = (allocator<char>)0x0;
  local_182b[5] = (allocator<char>)0x0;
  local_182b[6] = (allocator<char>)0x0;
  local_182b[7] = (allocator<char>)0x0;
  local_182b[8] = (allocator<char>)0x0;
  local_182b[9] = (allocator<char>)0x0;
  local_182b[10] = (allocator<char>)0x0;
  local_182b[0xb] = (allocator<char>)0x0;
  local_182b[0xc] = (allocator<char>)0x0;
  local_182b[0xd] = (allocator<char>)0x0;
  local_182b[0xe] = (allocator<char>)0x0;
  local_182b[0xf] = (allocator<char>)0x0;
  local_182b[0x10] = (allocator<char>)0x0;
  local_182b[0x11] = (allocator<char>)0x0;
  local_182b[0x12] = (allocator<char>)0x0;
  local_182b[0x13] = (allocator<char>)0x0;
  local_182b[0x14] = (allocator<char>)0x0;
  local_182b[0x15] = (allocator<char>)0x0;
  local_182b[0x16] = (allocator<char>)0x0;
  local_182b[0x17] = (allocator<char>)0x0;
  local_182b[0x18] = (allocator<char>)0x0;
  local_182b[0x19] = (allocator<char>)0x0;
  local_182b[0x1a] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  paVar3 = (allocator<RPCResult> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe2bc,in_stack_ffffffffffffe2b8),
             in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2a8,
             SUB41(in_stack_ffffffffffffe2a4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe29f,in_stack_ffffffffffffe298),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe290,
             (bool)in_stack_ffffffffffffe28f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffe288;
  __l_03._M_array = (iterator)in_stack_ffffffffffffe280;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffe28f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe278,__l_03,
             (allocator_type *)in_stack_ffffffffffffe270);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2bc,
             (string *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
             in_stack_ffffffffffffe2a8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2a4,in_stack_ffffffffffffe2a0),
             (bool)in_stack_ffffffffffffe29f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffe288;
  __l_04._M_array = (iterator)in_stack_ffffffffffffe280;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffe28f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe278,__l_04,
             (allocator_type *)in_stack_ffffffffffffe270);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2bc,
             (string *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
             in_stack_ffffffffffffe2a8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2a4,in_stack_ffffffffffffe2a0),
             (bool)in_stack_ffffffffffffe29f);
  fun = local_a88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  local_1868 = (pointer)0x0;
  pRStack_1860 = (pointer)0x0;
  local_1858 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2bc,
             (string *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
             in_stack_ffffffffffffe2a8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2a4,in_stack_ffffffffffffe2a0),
             (bool)in_stack_ffffffffffffe29f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_05._M_len._0_7_ = in_stack_ffffffffffffe288;
  __l_05._M_array = (iterator)in_stack_ffffffffffffe280;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffe28f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe278,__l_05,
             (allocator_type *)in_stack_ffffffffffffe270);
  paVar3 = (allocator<RPCResult> *)((ulong)paVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe2bc,in_stack_ffffffffffffe2b8),
             in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2a8,
             SUB41(in_stack_ffffffffffffe2a4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe29f,in_stack_ffffffffffffe298),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe290,
             (bool)in_stack_ffffffffffffe28f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_06._M_len._0_7_ = in_stack_ffffffffffffe288;
  __l_06._M_array = (iterator)in_stack_ffffffffffffe280;
  __l_06._M_len._7_1_ = in_stack_ffffffffffffe28f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe278,__l_06,
             (allocator_type *)in_stack_ffffffffffffe270);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2bc,
             (string *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0),
             in_stack_ffffffffffffe2a8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2a4,in_stack_ffffffffffffe2a0),
             (bool)in_stack_ffffffffffffe29f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffe2bc,in_stack_ffffffffffffe2b8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffe2b4,in_stack_ffffffffffffe2b0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  HelpExampleRpc(in_stack_ffffffffffffe270,in_stack_ffffffffffffe268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe28f,in_stack_ffffffffffffe288),
             (char *)in_stack_ffffffffffffe280,(allocator<char> *)in_stack_ffffffffffffe278);
  HelpExampleCli(in_stack_ffffffffffffe270,in_stack_ffffffffffffe268);
  std::operator+(in_stack_ffffffffffffe270,in_stack_ffffffffffffe268);
  RPCExamples::RPCExamples((RPCExamples *)paVar3,(string *)0x130135d);
  this_00 = (RPCArg *)local_1890;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<submitpackage()::__0,void>
            (in_stack_ffffffffffffe248,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe240);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffe3a8,in_stack_ffffffffffffe3a0,in_stack_ffffffffffffe398,
             in_stack_ffffffffffffe390,in_stack_ffffffffffffe388,in_stack_ffffffffffffe380,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1890 + 0x22));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_186d);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_186c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_186b);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1bc0 = local_a00;
  do {
    local_1bc0 = local_1bc0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1bc0 != local_b98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1bd8 = local_1448;
  do {
    local_1bd8 = local_1bd8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1bd8 != local_14d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_184a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1849);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_182c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_182b);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1bf0 = local_c18;
  do {
    local_1bf0 = local_1bf0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1bf0 != local_ca0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1c08 = local_ce0;
  do {
    local_1c08 = local_1c08 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1c08 != local_f88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_180c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_180b);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1c20 = local_1088;
  do {
    local_1c20 = local_1c20 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1c20 != local_1220);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1c38 = local_1300;
  do {
    local_1c38 = local_1c38 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1c38 != local_1388);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_17ea);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_17e9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_17ca);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_17c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_17b8 + 0xf));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1789);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_176a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1769);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_174a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1749);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_172a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1729);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_170a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1709);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_16ea);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_16e9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_16ca);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_16c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe248);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_16a2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_16a1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1682);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1681);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe248);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar4 = local_360;
  local_1c50 = local_48;
  do {
    local_1c50 = local_1c50 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_1c50 != puVar4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1664);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1663);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe248);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar4 = local_508;
  puVar1 = local_400;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1661);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1659);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1639);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1631);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1612);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1611);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan submitpackage()
{
    return RPCHelpMan{"submitpackage",
        "Submit a package of raw transactions (serialized, hex-encoded) to local node.\n"
        "The package will be validated according to consensus and mempool policy rules. If any transaction passes, it will be accepted to mempool.\n"
        "This RPC is experimental and the interface may be unstable. Refer to doc/policy/packages.md for documentation on package policies.\n"
        "Warning: successful submission does not mean the transactions will propagate throughout the network.\n"
        ,
        {
            {"package", RPCArg::Type::ARR, RPCArg::Optional::NO, "An array of raw transactions.\n"
                "The package must solely consist of a child and its parents. None of the parents may depend on each other.\n"
                "The package must be topologically sorted, with the child being the last element in the array.",
                {
                    {"rawtx", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, ""},
                },
            },
            {"maxfeerate", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(DEFAULT_MAX_RAW_TX_FEE_RATE.GetFeePerK())},
             "Reject transactions whose fee rate is higher than the specified value, expressed in " + CURRENCY_UNIT +
                 "/kvB.\nFee rates larger than 1BTC/kvB are rejected.\nSet to 0 to accept any fee rate."},
            {"maxburnamount", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(DEFAULT_MAX_BURN_AMOUNT)},
             "Reject transactions with provably unspendable outputs (e.g. 'datacarrier' outputs that use the OP_RETURN opcode) greater than the specified value, expressed in " + CURRENCY_UNIT + ".\n"
             "If burning funds through unspendable outputs is desired, increase this value.\n"
             "This check is based on heuristics and does not guarantee spendability of outputs.\n"
            },
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "package_msg", "The transaction package result message. \"success\" indicates all transactions were accepted into or are already in the mempool."},
                {RPCResult::Type::OBJ_DYN, "tx-results", "transaction results keyed by wtxid",
                {
                    {RPCResult::Type::OBJ, "wtxid", "transaction wtxid", {
                        {RPCResult::Type::STR_HEX, "txid", "The transaction hash in hex"},
                        {RPCResult::Type::STR_HEX, "other-wtxid", /*optional=*/true, "The wtxid of a different transaction with the same txid but different witness found in the mempool. This means the submitted transaction was ignored."},
                        {RPCResult::Type::NUM, "vsize", /*optional=*/true, "Sigops-adjusted virtual transaction size."},
                        {RPCResult::Type::OBJ, "fees", /*optional=*/true, "Transaction fees", {
                            {RPCResult::Type::STR_AMOUNT, "base", "transaction fee in " + CURRENCY_UNIT},
                            {RPCResult::Type::STR_AMOUNT, "effective-feerate", /*optional=*/true, "if the transaction was not already in the mempool, the effective feerate in " + CURRENCY_UNIT + " per KvB. For example, the package feerate and/or feerate with modified fees from prioritisetransaction."},
                            {RPCResult::Type::ARR, "effective-includes", /*optional=*/true, "if effective-feerate is provided, the wtxids of the transactions whose fees and vsizes are included in effective-feerate.",
                                {{RPCResult::Type::STR_HEX, "", "transaction wtxid in hex"},
                            }},
                        }},
                        {RPCResult::Type::STR, "error", /*optional=*/true, "The transaction error string, if it was rejected by the mempool"},
                    }}
                }},
                {RPCResult::Type::ARR, "replaced-transactions", /*optional=*/true, "List of txids of replaced transactions",
                {
                    {RPCResult::Type::STR_HEX, "", "The transaction id"},
                }},
            },
        },
        RPCExamples{
            HelpExampleRpc("submitpackage", R"(["rawtx1", "rawtx2"])") +
            HelpExampleCli("submitpackage", R"('["rawtx1", "rawtx2"]')")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const UniValue raw_transactions = request.params[0].get_array();
            if (raw_transactions.size() < 2 || raw_transactions.size() > MAX_PACKAGE_COUNT) {
                throw JSONRPCError(RPC_INVALID_PARAMETER,
                                   "Array must contain between 2 and " + ToString(MAX_PACKAGE_COUNT) + " transactions.");
            }

            // Fee check needs to be run with chainstate and package context
            const CFeeRate max_raw_tx_fee_rate{ParseFeeRate(self.Arg<UniValue>("maxfeerate"))};
            std::optional<CFeeRate> client_maxfeerate{max_raw_tx_fee_rate};
            // 0-value is special; it's mapped to no sanity check
            if (max_raw_tx_fee_rate == CFeeRate(0)) {
                client_maxfeerate = std::nullopt;
            }

            // Burn sanity check is run with no context
            const CAmount max_burn_amount = request.params[2].isNull() ? 0 : AmountFromValue(request.params[2]);

            std::vector<CTransactionRef> txns;
            txns.reserve(raw_transactions.size());
            for (const auto& rawtx : raw_transactions.getValues()) {
                CMutableTransaction mtx;
                if (!DecodeHexTx(mtx, rawtx.get_str())) {
                    throw JSONRPCError(RPC_DESERIALIZATION_ERROR,
                                       "TX decode failed: " + rawtx.get_str() + " Make sure the tx has at least one input.");
                }

                for (const auto& out : mtx.vout) {
                    if((out.scriptPubKey.IsUnspendable() || !out.scriptPubKey.HasValidOps()) && out.nValue > max_burn_amount) {
                        throw JSONRPCTransactionError(TransactionError::MAX_BURN_EXCEEDED);
                    }
                }

                txns.emplace_back(MakeTransactionRef(std::move(mtx)));
            }
            if (!IsChildWithParentsTree(txns)) {
                throw JSONRPCTransactionError(TransactionError::INVALID_PACKAGE, "package topology disallowed. not child-with-parents or parents depend on each other.");
            }

            NodeContext& node = EnsureAnyNodeContext(request.context);
            CTxMemPool& mempool = EnsureMemPool(node);
            Chainstate& chainstate = EnsureChainman(node).ActiveChainstate();
            const auto package_result = WITH_LOCK(::cs_main, return ProcessNewPackage(chainstate, mempool, txns, /*test_accept=*/ false, client_maxfeerate));

            std::string package_msg = "success";

            // First catch package-wide errors, continue if we can
            switch(package_result.m_state.GetResult()) {
                case PackageValidationResult::PCKG_RESULT_UNSET:
                {
                    // Belt-and-suspenders check; everything should be successful here
                    CHECK_NONFATAL(package_result.m_tx_results.size() == txns.size());
                    for (const auto& tx : txns) {
                        CHECK_NONFATAL(mempool.exists(GenTxid::Txid(tx->GetHash())));
                    }
                    break;
                }
                case PackageValidationResult::PCKG_MEMPOOL_ERROR:
                {
                    // This only happens with internal bug; user should stop and report
                    throw JSONRPCTransactionError(TransactionError::MEMPOOL_ERROR,
                        package_result.m_state.GetRejectReason());
                }
                case PackageValidationResult::PCKG_POLICY:
                case PackageValidationResult::PCKG_TX:
                {
                    // Package-wide error we want to return, but we also want to return individual responses
                    package_msg = package_result.m_state.ToString();
                    CHECK_NONFATAL(package_result.m_tx_results.size() == txns.size() ||
                            package_result.m_tx_results.empty());
                    break;
                }
            }

            size_t num_broadcast{0};
            for (const auto& tx : txns) {
                // We don't want to re-submit the txn for validation in BroadcastTransaction
                if (!mempool.exists(GenTxid::Txid(tx->GetHash()))) {
                    continue;
                }

                // We do not expect an error here; we are only broadcasting things already/still in mempool
                std::string err_string;
                const auto err = BroadcastTransaction(node, tx, err_string, /*max_tx_fee=*/0, /*relay=*/true, /*wait_callback=*/true);
                if (err != TransactionError::OK) {
                    throw JSONRPCTransactionError(err,
                        strprintf("transaction broadcast failed: %s (%d transactions were broadcast successfully)",
                            err_string, num_broadcast));
                }
                num_broadcast++;
            }

            UniValue rpc_result{UniValue::VOBJ};
            rpc_result.pushKV("package_msg", package_msg);
            UniValue tx_result_map{UniValue::VOBJ};
            std::set<uint256> replaced_txids;
            for (const auto& tx : txns) {
                UniValue result_inner{UniValue::VOBJ};
                result_inner.pushKV("txid", tx->GetHash().GetHex());
                auto it = package_result.m_tx_results.find(tx->GetWitnessHash());
                if (it == package_result.m_tx_results.end()) {
                    // No results, report error and continue
                    result_inner.pushKV("error", "unevaluated");
                    continue;
                }
                const auto& tx_result = it->second;
                switch(it->second.m_result_type) {
                case MempoolAcceptResult::ResultType::DIFFERENT_WITNESS:
                    result_inner.pushKV("other-wtxid", it->second.m_other_wtxid.value().GetHex());
                    break;
                case MempoolAcceptResult::ResultType::INVALID:
                    result_inner.pushKV("error", it->second.m_state.ToString());
                    break;
                case MempoolAcceptResult::ResultType::VALID:
                case MempoolAcceptResult::ResultType::MEMPOOL_ENTRY:
                    result_inner.pushKV("vsize", int64_t{it->second.m_vsize.value()});
                    UniValue fees(UniValue::VOBJ);
                    fees.pushKV("base", ValueFromAmount(it->second.m_base_fees.value()));
                    if (tx_result.m_result_type == MempoolAcceptResult::ResultType::VALID) {
                        // Effective feerate is not provided for MEMPOOL_ENTRY transactions even
                        // though modified fees is known, because it is unknown whether package
                        // feerate was used when it was originally submitted.
                        fees.pushKV("effective-feerate", ValueFromAmount(tx_result.m_effective_feerate.value().GetFeePerK()));
                        UniValue effective_includes_res(UniValue::VARR);
                        for (const auto& wtxid : tx_result.m_wtxids_fee_calculations.value()) {
                            effective_includes_res.push_back(wtxid.ToString());
                        }
                        fees.pushKV("effective-includes", std::move(effective_includes_res));
                    }
                    result_inner.pushKV("fees", std::move(fees));
                    for (const auto& ptx : it->second.m_replaced_transactions) {
                        replaced_txids.insert(ptx->GetHash());
                    }
                    break;
                }
                tx_result_map.pushKV(tx->GetWitnessHash().GetHex(), std::move(result_inner));
            }
            rpc_result.pushKV("tx-results", std::move(tx_result_map));
            UniValue replaced_list(UniValue::VARR);
            for (const uint256& hash : replaced_txids) replaced_list.push_back(hash.ToString());
            rpc_result.pushKV("replaced-transactions", std::move(replaced_list));
            return rpc_result;
        },
    };
}